

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlneuron.cxx
# Opt level: O0

void __thiscall
MlNeuron::MlNeuron(MlNeuron *this,Time *time,double v_0,double theta,double spikeheight,double tau,
                  double v_rest,string *name,string *type)

{
  string *reversal;
  double time_00;
  VoltageDependance *this_00;
  StochasticVariable *pSVar1;
  MlCalciumChannel *this_01;
  MlPotassiumChannel *this_02;
  double dVar2;
  allocator<char> local_621;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  undefined1 local_5d2;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  undefined1 local_582;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  undefined1 local_532;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  undefined1 local_4e2;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  undefined1 local_492;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  Unit local_3f8;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  Unit local_340;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  Unit local_288;
  Unit local_220;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  string local_90;
  string local_70;
  string *local_50;
  string *type_local;
  string *name_local;
  double v_rest_local;
  double tau_local;
  double spikeheight_local;
  double theta_local;
  double v_0_local;
  Time *time_local;
  MlNeuron *this_local;
  
  local_50 = type;
  type_local = name;
  name_local = (string *)v_rest;
  v_rest_local = tau;
  tau_local = spikeheight;
  spikeheight_local = theta;
  theta_local = v_0;
  v_0_local = (double)time;
  time_local = (Time *)this;
  std::__cxx11::string::string((string *)&local_70,(string *)name);
  std::__cxx11::string::string((string *)&local_90,(string *)local_50);
  SpikingNeuron::SpikingNeuron(&this->super_SpikingNeuron,time,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  time_00 = v_0_local;
  dVar2 = theta_local;
  (this->super_SpikingNeuron).super_Neuron._vptr_Neuron = (_func_int **)&PTR_addStimulus_0018fb28;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Parametric._vptr_Parametric = (_func_int **)&PTR__MlNeuron_0018fb70;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__MlNeuron_0018fc08;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Physical._vptr_Physical = (_func_int **)&PTR__MlNeuron_0018fc50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"V",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"Differential Equation",&local_e9);
  DifferentialEquation::DifferentialEquation
            (&this->mlneuronMembrane,(Time *)time_00,dVar2,0.0,&local_c0,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"Differential Equation",&local_139);
  DifferentialEquation::DifferentialEquation(&this->mlneuronRelaxation,&local_110,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"threshold",&local_161);
  Parametric::addParameter
            ((Parametric *)&(this->super_SpikingNeuron).super_StochasticEventGenerator,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"spike-height",&local_189)
  ;
  Parametric::addParameter
            ((Parametric *)&(this->super_SpikingNeuron).super_StochasticEventGenerator,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"membrane",&local_1b1);
  Parametric::addParameter
            ((Parametric *)&(this->super_SpikingNeuron).super_StochasticEventGenerator,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
              super_StochasticProcess.super_Physical.physicalDescription,"voltage");
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
              super_StochasticProcess.stochDescription,"LIF Neuron membrane");
  (this->super_SpikingNeuron).super_StochasticEventGenerator.eventCurrentValue = false;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.eventNextValue = false;
  this->mlneuronTheta = spikeheight_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"m",&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"V",&local_2d1);
  Unit::Unit(&local_288,&local_2a8,&local_2d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"u",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"F",&local_389);
  Unit::Unit(&local_340,&local_360,&local_388);
  operator*(&local_220,&local_288,&local_340);
  Physical::setUnit(&(this->mlneuronMembrane).super_StochasticVariable.super_StochasticProcess.
                     super_Physical,&local_220);
  Unit::~Unit(&local_220);
  Unit::~Unit(&local_340);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  Unit::~Unit(&local_288);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"m",&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"V",&local_441);
  Unit::Unit(&local_3f8,&local_418,&local_440);
  Unit::operator=(&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                   super_StochasticVariable.super_StochasticProcess.super_Physical.physicalUnit,
                  &local_3f8);
  Unit::~Unit(&local_3f8);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  this_00 = (VoltageDependance *)operator_new(0x160);
  reversal = name_local;
  local_492 = 1;
  dVar2 = 1.0 / v_rest_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"leak",&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"Weighted Difference",&local_491);
  VoltageDependance::VoltageDependance(this_00,dVar2,(double)reversal,&local_468,&local_490);
  local_492 = 0;
  pSVar1 = (StochasticVariable *)operator_new(0x148);
  dVar2 = v_0_local;
  local_4e2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"t",&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"Time Process",&local_4e1)
  ;
  TimeProcess::TimeProcess((TimeProcess *)pSVar1,(Time *)dVar2,&local_4b8,&local_4e0);
  local_4e2 = 0;
  DifferentialEquation::addTerm(&this->mlneuronMembrane,(StochasticFunction *)this_00,pSVar1);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  this_01 = (MlCalciumChannel *)operator_new(0x168);
  local_532 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"",&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"Calcium Channel",&local_531);
  MlCalciumChannel::MlCalciumChannel(this_01,0.0,0.0,&local_508,&local_530);
  local_532 = 0;
  pSVar1 = (StochasticVariable *)operator_new(0x148);
  dVar2 = v_0_local;
  local_582 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"t",&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"Time Process",&local_581)
  ;
  TimeProcess::TimeProcess((TimeProcess *)pSVar1,(Time *)dVar2,&local_558,&local_580);
  local_582 = 0;
  DifferentialEquation::addTerm(&this->mlneuronMembrane,(StochasticFunction *)this_01,pSVar1);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator(&local_531);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  this_02 = (MlPotassiumChannel *)operator_new(0x308);
  local_5d2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"",&local_5a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"Potassium Channel",&local_5d1);
  MlPotassiumChannel::MlPotassiumChannel(this_02,0.0,0.0,&local_5a8,&local_5d0);
  local_5d2 = 0;
  pSVar1 = (StochasticVariable *)operator_new(0x148);
  dVar2 = v_0_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f8,"t",&local_5f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"Time Process",&local_621)
  ;
  TimeProcess::TimeProcess((TimeProcess *)pSVar1,(Time *)dVar2,&local_5f8,&local_620);
  DifferentialEquation::addTerm(&this->mlneuronMembrane,(StochasticFunction *)this_02,pSVar1);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  return;
}

Assistant:

MlNeuron::MlNeuron(Time *time, double v_0, double theta, double spikeheight, double tau, double v_rest, const string& name, const string& type)
	: SpikingNeuron(time, name, type), mlneuronMembrane(time, v_0, 0.0, "V")
{
	// parameter accessors
	addParameter("threshold");
	addParameter("spike-height");
	addParameter("membrane");
	
	// write descriptions
	physicalDescription = "voltage";
	stochDescription = "LIF Neuron membrane";
	
	// assign values
	eventCurrentValue = false;
	eventNextValue = false;
	mlneuronTheta = theta;	
	mlneuronMembrane.setUnit( Unit("m","V") * Unit("u","F") );
	physicalUnit = Unit("m","V");
	
	// add decay terms
	mlneuronMembrane.addTerm( new VoltageDependance(1.0/tau, v_rest, "leak"), new TimeProcess(time) );
	mlneuronMembrane.addTerm( new MlCalciumChannel(0.0, 0.0, ""), new TimeProcess(time) );
	mlneuronMembrane.addTerm( new MlPotassiumChannel(0.0, 0.0, ""), new TimeProcess(time) );
}